

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_blitter.cpp
# Opt level: O0

void __thiscall
QBlitterPaintEnginePrivate::fillRect
          (QBlitterPaintEnginePrivate *this,QRectF *rect,QColor *color,bool alpha)

{
  byte bVar1;
  bool bVar2;
  CompositionMode CVar3;
  int iVar4;
  QClipData *pQVar5;
  QBlittable *pQVar6;
  QRasterPaintEngineState *pQVar7;
  const_iterator pQVar8;
  byte in_CL;
  undefined8 in_RDX;
  QRectF *in_RSI;
  QBlitterPaintEnginePrivate *in_RDI;
  long in_FS_OFFSET;
  qreal qVar9;
  QBlittablePlatformPixmap *this_00;
  QRect *rect_1;
  const_iterator __end4;
  const_iterator __begin4;
  QRegion *__range4;
  QClipData *clipData;
  QBlitterPaintEngine *q;
  QRectF deviceRect;
  QRect intersectRect;
  QRectF targetRect;
  QRect *in_stack_fffffffffffffda8;
  QRect *in_stack_fffffffffffffdb0;
  QRasterPaintEnginePrivate *in_stack_fffffffffffffdb8;
  QBlittablePlatformPixmap *in_stack_fffffffffffffdc0;
  QRectF *in_stack_fffffffffffffdd8;
  const_iterator local_1c8;
  QRectF *in_stack_fffffffffffffe40;
  QTransform *in_stack_fffffffffffffe48;
  QRectF local_188;
  QRectF local_168;
  QRectF local_148;
  undefined1 local_128 [32];
  undefined1 local_108 [32];
  QRect local_e8;
  undefined1 local_d8 [48];
  QRectF local_a8 [2];
  QRectF local_68;
  qreal local_48;
  qreal local_40;
  qreal local_38;
  qreal local_30;
  QRectF local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_CL & 1;
  q_func(in_RDI);
  QBlittablePlatformPixmap::unmarkRasterOverlay(in_RDI->pmData,in_RSI);
  local_28.xp = in_RSI->xp;
  local_28.yp = in_RSI->yp;
  local_28.w = in_RSI->w;
  local_28.h = in_RSI->h;
  if (in_RDI->hasXForm != 0) {
    QRasterPaintEngine::state((QRasterPaintEngine *)0x55aec3);
    QTransform::mapRect(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    local_28.xp = local_48;
    local_28.yp = local_40;
    local_28.w = local_38;
    local_28.h = local_30;
  }
  pQVar5 = QRasterPaintEnginePrivate::clip(in_stack_fffffffffffffdb8);
  if (pQVar5 == (QClipData *)0x0) {
    qVar9 = QRectF::x(&local_28);
    if ((0.0 <= qVar9) && (qVar9 = QRectF::y(&local_28), 0.0 <= qVar9)) {
      qVar9 = QRectF::width(&local_28);
      QPaintEngine::paintDevice((QPaintEngine *)0x55b2d4);
      iVar4 = QPaintDevice::width((QPaintDevice *)0x55b2dc);
      if (qVar9 <= (double)iVar4) {
        qVar9 = QRectF::height(&local_28);
        QPaintEngine::paintDevice((QPaintEngine *)0x55b310);
        iVar4 = QPaintDevice::height((QPaintDevice *)0x55b318);
        if (qVar9 <= (double)iVar4) {
          unlock((QBlitterPaintEnginePrivate *)0x55b336);
          if (bVar1 == 0) {
            pQVar6 = QBlittablePlatformPixmap::blittable(in_stack_fffffffffffffdc0);
            (*pQVar6->_vptr_QBlittable[2])(pQVar6,&local_28,in_RDX);
          }
          else {
            pQVar6 = QBlittablePlatformPixmap::blittable(in_stack_fffffffffffffdc0);
            pQVar7 = QRasterPaintEngine::state((QRasterPaintEngine *)0x55b370);
            CVar3 = QPaintEngineState::compositionMode
                              (&(pQVar7->super_QPainterState).super_QPaintEngineState);
            (*pQVar6->_vptr_QBlittable[4])(pQVar6,&local_28,in_RDX,(ulong)CVar3);
          }
          goto LAB_0055b52d;
        }
      }
    }
    local_148.xp = -NAN;
    local_148.yp = -NAN;
    local_148.w = -NAN;
    local_148.h = -NAN;
    QPaintEngine::paintDevice((QPaintEngine *)0x55b410);
    iVar4 = QPaintDevice::width((QPaintDevice *)0x55b418);
    this_00 = (QBlittablePlatformPixmap *)(double)iVar4;
    QPaintEngine::paintDevice((QPaintEngine *)0x55b42f);
    iVar4 = QPaintDevice::height((QPaintDevice *)0x55b437);
    QRectF::QRectF(&local_148,0.0,0.0,(qreal)this_00,(double)iVar4);
    unlock((QBlitterPaintEnginePrivate *)0x55b45e);
    if (bVar1 == 0) {
      pQVar6 = QBlittablePlatformPixmap::blittable(this_00);
      QRectF::operator&(&local_188,(QRectF *)&local_148);
      (*pQVar6->_vptr_QBlittable[2])(pQVar6,&local_188,in_RDX);
    }
    else {
      pQVar6 = QBlittablePlatformPixmap::blittable(this_00);
      QRectF::operator&(&local_168,(QRectF *)&local_148);
      pQVar7 = QRasterPaintEngine::state((QRasterPaintEngine *)0x55b4b5);
      CVar3 = QPaintEngineState::compositionMode
                        (&(pQVar7->super_QPainterState).super_QPaintEngineState);
      (*pQVar6->_vptr_QBlittable[4])(pQVar6,&local_168,in_RDX,(ulong)CVar3);
    }
  }
  else if (((byte)pQVar5->field_0x48 >> 1 & 1) == 0) {
    if (((byte)pQVar5->field_0x48 >> 2 & 1) != 0) {
      local_1c8 = QRegion::begin((QRegion *)in_stack_fffffffffffffdb0);
      pQVar8 = QRegion::end((QRegion *)in_stack_fffffffffffffdb0);
      for (; local_1c8 != pQVar8; local_1c8 = local_1c8 + 1) {
        local_d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_e8 = QRectF::toRect(in_stack_fffffffffffffdd8);
        local_d8._0_16_ =
             (undefined1  [16])
             QRect::intersected(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
        bVar2 = QRect::isEmpty(in_stack_fffffffffffffdb0);
        if (!bVar2) {
          unlock((QBlitterPaintEnginePrivate *)0x55b19d);
          if (bVar1 == 0) {
            pQVar6 = QBlittablePlatformPixmap::blittable(in_stack_fffffffffffffdc0);
            QRectF::QRectF((QRectF *)in_stack_fffffffffffffdc0,(QRect *)in_stack_fffffffffffffdb8);
            (*pQVar6->_vptr_QBlittable[2])(pQVar6,local_128,in_RDX);
          }
          else {
            pQVar6 = QBlittablePlatformPixmap::blittable(in_stack_fffffffffffffdc0);
            QRectF::QRectF((QRectF *)in_stack_fffffffffffffdc0,(QRect *)in_stack_fffffffffffffdb8);
            pQVar7 = QRasterPaintEngine::state((QRasterPaintEngine *)0x55b1ec);
            CVar3 = QPaintEngineState::compositionMode
                              (&(pQVar7->super_QPainterState).super_QPaintEngineState);
            (*pQVar6->_vptr_QBlittable[4])(pQVar6,local_108,in_RDX,(ulong)CVar3);
          }
        }
      }
    }
  }
  else {
    unlock((QBlitterPaintEnginePrivate *)0x55af68);
    if (bVar1 == 0) {
      pQVar6 = QBlittablePlatformPixmap::blittable(in_stack_fffffffffffffdc0);
      QRectF::QRectF((QRectF *)in_stack_fffffffffffffdc0,(QRect *)in_stack_fffffffffffffdb8);
      QRectF::operator&(local_a8,(QRectF *)&local_28);
      (*pQVar6->_vptr_QBlittable[2])(pQVar6,local_a8,in_RDX);
    }
    else {
      pQVar6 = QBlittablePlatformPixmap::blittable(in_stack_fffffffffffffdc0);
      QRectF::QRectF((QRectF *)in_stack_fffffffffffffdc0,(QRect *)in_stack_fffffffffffffdb8);
      QRectF::operator&(&local_68,(QRectF *)&local_28);
      pQVar7 = QRasterPaintEngine::state((QRasterPaintEngine *)0x55afdc);
      CVar3 = QPaintEngineState::compositionMode
                        (&(pQVar7->super_QPainterState).super_QPaintEngineState);
      (*pQVar6->_vptr_QBlittable[4])(pQVar6,&local_68,in_RDX,(ulong)CVar3);
    }
  }
LAB_0055b52d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QBlitterPaintEnginePrivate::fillRect(const QRectF &rect, const QColor &color, bool alpha)
{
    Q_Q(QBlitterPaintEngine);
    pmData->unmarkRasterOverlay(rect);
    QRectF targetRect = rect;
    if (hasXForm)
        targetRect = q->state()->matrix.mapRect(rect);
    const QClipData *clipData = clip();
    if (clipData) {
        if (clipData->hasRectClip) {
            unlock();
            if (alpha)
                pmData->blittable()->alphaFillRect(targetRect & clipData->clipRect, color, q->state()->compositionMode());
            else
                pmData->blittable()->fillRect(targetRect & clipData->clipRect, color);
        } else if (clipData->hasRegionClip) {
            for (const QRect &rect : clipData->clipRegion) {
                QRect intersectRect = rect.intersected(targetRect.toRect());
                if (!intersectRect.isEmpty()) {
                    unlock();
                    if (alpha)
                        pmData->blittable()->alphaFillRect(intersectRect, color, q->state()->compositionMode());
                    else
                        pmData->blittable()->fillRect(intersectRect, color);
                }
            }
        }
    } else {
        if (targetRect.x() >= 0 && targetRect.y() >= 0
            && targetRect.width() <= q->paintDevice()->width()
            && targetRect.height() <= q->paintDevice()->height()) {
            unlock();
            if (alpha)
                pmData->blittable()->alphaFillRect(targetRect, color, q->state()->compositionMode());
            else
                pmData->blittable()->fillRect(targetRect, color);
        } else {
            QRectF deviceRect(0, 0, q->paintDevice()->width(), q->paintDevice()->height());
            unlock();
            if (alpha)
                pmData->blittable()->alphaFillRect(deviceRect & targetRect, color, q->state()->compositionMode());
            else
                pmData->blittable()->fillRect(deviceRect & targetRect, color);
        }
    }
}